

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_ctrlpt.c
# Opt level: O1

int genaUnSubscribe(UpnpClient_Handle client_handle,UpnpString *in_sid)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  GenlibClientSubscription *p;
  GenlibClientSubscription *q;
  UpnpString *pUVar3;
  UpnpString *sid;
  int iVar4;
  int iVar5;
  char *file;
  Handle_Info *handle_info;
  http_parser_t response;
  Handle_Info *local_220;
  http_parser_t local_218;
  Handle_Info **ppHVar6;
  
  pUVar3 = in_sid;
  p = GenlibClientSubscription_new();
  HandleLock((char *)0x20f,(int)pUVar3);
  ppHVar6 = &local_220;
  UVar1 = GetHandleInfo(client_handle,ppHVar6);
  iVar5 = (int)ppHVar6;
  file = (char *)0x211;
  iVar4 = -100;
  if (UVar1 == HND_CLIENT) {
    pUVar3 = in_sid;
    q = GetClientSubClientSID(local_220->ClientSubList,in_sid);
    iVar5 = (int)pUVar3;
    if (q == (GenlibClientSubscription *)0x0) {
      iVar4 = -0x6d;
      file = (char *)0x217;
    }
    else {
      GenlibClientSubscription_assign(p,q);
      HandleUnlock((char *)0x21c,(int)q);
      pUVar3 = GenlibClientSubscription_get_EventURL(p);
      sid = GenlibClientSubscription_get_ActualSID(p);
      iVar2 = gena_unsubscribe(pUVar3,sid,&local_218);
      iVar5 = (int)sid;
      if (iVar2 == 0) {
        httpmsg_destroy(&local_218.msg);
      }
      free_client_subscription(p);
      HandleLock((char *)0x227,iVar5);
      ppHVar6 = &local_220;
      UVar1 = GetHandleInfo(client_handle,ppHVar6);
      iVar5 = (int)ppHVar6;
      file = (char *)0x229;
      if (UVar1 == HND_CLIENT) {
        RemoveClientSubClientSID(&local_220->ClientSubList,in_sid);
        iVar5 = (int)in_sid;
        file = (char *)0x22e;
        iVar4 = iVar2;
      }
    }
  }
  HandleUnlock(file,iVar5);
  GenlibClientSubscription_delete(p);
  return iVar4;
}

Assistant:

int genaUnSubscribe(UpnpClient_Handle client_handle, const UpnpString *in_sid)
{
	GenlibClientSubscription *sub = NULL;
	int return_code = GENA_SUCCESS;
	struct Handle_Info *handle_info;
	GenlibClientSubscription *sub_copy = GenlibClientSubscription_new();
	http_parser_t response;

	/* validate handle and sid */
	HandleLock(__FILE__, __LINE__);
	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		HandleUnlock(__FILE__, __LINE__);
		return_code = GENA_E_BAD_HANDLE;
		goto exit_function;
	}
	sub = GetClientSubClientSID(handle_info->ClientSubList, in_sid);
	if (sub == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return_code = GENA_E_BAD_SID;
		goto exit_function;
	}
	GenlibClientSubscription_assign(sub_copy, sub);
	HandleUnlock(__FILE__, __LINE__);

	return_code = gena_unsubscribe(
		GenlibClientSubscription_get_EventURL(sub_copy),
		GenlibClientSubscription_get_ActualSID(sub_copy),
		&response);
	if (return_code == 0) {
		httpmsg_destroy(&response.msg);
	}
	free_client_subscription(sub_copy);

	HandleLock(__FILE__, __LINE__);
	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		HandleUnlock(__FILE__, __LINE__);
		return_code = GENA_E_BAD_HANDLE;
		goto exit_function;
	}
	RemoveClientSubClientSID(&handle_info->ClientSubList, in_sid);
	HandleUnlock(__FILE__, __LINE__);

exit_function:
	GenlibClientSubscription_delete(sub_copy);
	return return_code;
}